

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

double __thiscall
bgui::ImageAdapter<unsigned_char>::getPixel(ImageAdapter<unsigned_char> *this,float x,float y,int c)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  work_t wVar4;
  size_type sVar5;
  int *piVar6;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  double dVar7;
  double dVar8;
  float in_XMM1_Da;
  double f;
  double ret;
  int ds;
  int j;
  int j_00;
  undefined8 in_stack_ffffffffffffffc8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffffd0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar9;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  int local_24;
  int local_20;
  int local_1c;
  float local_18;
  float local_14;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_8;
  
  local_1c = in_ESI;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  sVar5 = std::
          vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
          ::size((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                  *)(in_RDI + 0x90));
  if (sVar5 == 0) {
    bVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                      (*(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)
                        (in_RDI + 0x70),(long)local_14,(long)local_18,local_1c);
    local_8 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)(double)bVar1;
  }
  else {
    dVar7 = log(1.0 / *(double *)(in_RDI + 0x48));
    dVar8 = log(2.0);
    local_20 = (int)(dVar7 / dVar8) + -1;
    sVar5 = std::
            vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
            ::size((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90));
    local_24 = (int)sVar5 + -1;
    piVar6 = std::min<int>(&local_24,&local_20);
    local_20 = *piVar6;
    iVar2 = 1 << ((char)local_20 + 1U & 0x1f);
    j_00 = (int)((ulong)in_RDI >> 0x20);
    if (local_20 < 0) {
      iVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffffd0,(float)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                         ,(float)in_stack_ffffffffffffffc8,j_00);
    }
    else {
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)local_20);
      iVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffffd0,(float)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                         ,(float)in_stack_ffffffffffffffc8,j_00);
    }
    pIVar9 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)(double)iVar3;
    local_8 = pIVar9;
    if (((-1 < local_20 + 1) &&
        (iVar3 = local_20 + 1,
        sVar5 = std::
                vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                ::size((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                        *)(in_RDI + 0x90)), local_8 = pIVar9, iVar3 < (int)sVar5)) &&
       (dVar7 = (1.0 / *(double *)(in_RDI + 0x48) - (double)iVar2) / (double)iVar2, 1e-06 < dVar7))
    {
      dVar8 = dVar7;
      this_00 = pIVar9;
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)(local_20 + 1));
      wVar4 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (this_00,(float)((ulong)dVar8 >> 0x20),SUB84(dVar8,0),j_00);
      local_8 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                ((1.0 - dVar7) * (double)pIVar9 + dVar7 * (double)wVar4);
    }
  }
  return (double)local_8;
}

Assistant:

double getPixel(float x, float y, int c) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);
        double ret;

        if (j < 0)
        {
          ret=image->getBilinear(x, y, c);
        }
        else
        {
          ret=mipmap[j].getBilinear(x/ds, y/ds, c);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            ret=(1-f)*ret+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), c);
          }
        }

        return ret;
      }

      return image->get(static_cast<long>(x), static_cast<long>(y), c);
    }